

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void superblock_recovery_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  sb_decision_t sVar4;
  __pid_t __pid;
  int iVar5;
  fdb_status extraout_EAX;
  size_t sVar6;
  size_t valuelen;
  char *pcVar7;
  ulong uVar8;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_snapshot_info_t *markers;
  void *rvalue;
  uint64_t num_markers;
  fdb_kvs_handle *snap_db;
  size_t rvalue_len;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  system("rm -rf  staleblktest* > errorlog.txt");
  fVar3 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x60b);
    superblock_recovery_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x60b,"void superblock_recovery_test()");
  }
  fVar3 = fdb_kvs_open(dbfile,&db,"db",&kvs_config);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x60d);
    superblock_recovery_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x60d,"void superblock_recovery_test()");
  }
  for (uVar8 = 0; pfVar2 = db, uVar8 < fconfig.num_keeping_headers + 1; uVar8 = uVar8 + 1) {
    builtin_strncpy(keybuf,"key",4);
    sVar6 = strlen(keybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,(void *)0x0,0);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x613);
      superblock_recovery_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x613,"void superblock_recovery_test()");
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x615);
      superblock_recovery_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x615,"void superblock_recovery_test()");
    }
  }
  fVar3 = fdb_get_file_info(dbfile,&file_info);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x619);
    superblock_recovery_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x619,"void superblock_recovery_test()");
  }
  while (file_info.file_size < 0x1000000) {
    builtin_strncpy(keybuf,"key",4);
    sprintf(bodybuf,"body%d",uVar8 & 0xffffffff);
    pfVar2 = db;
    sVar6 = strlen(keybuf);
    valuelen = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar6,bodybuf,valuelen);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x620);
      superblock_recovery_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x620,"void superblock_recovery_test()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x622);
      superblock_recovery_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x622,"void superblock_recovery_test()");
    }
  }
  sVar4 = sb_check_block_reusing(db);
  if (sVar4 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x625);
    superblock_recovery_test()::__test_pass = '\x01';
    sVar4 = sb_check_block_reusing(db);
    if (sVar4 != SBD_RECLAIM) {
      __assert_fail("sb_check_block_reusing(db) == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x625,"void superblock_recovery_test()");
    }
  }
  fVar3 = fdb_kvs_close(db);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x629);
    superblock_recovery_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x629,"void superblock_recovery_test()");
  }
  fVar3 = fdb_close(dbfile);
  pFVar1 = _stderr;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x62b);
    superblock_recovery_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x62b,"void superblock_recovery_test()");
  }
  __pid = fork();
  if (__pid == 0) {
    child_function();
    fVar3 = extraout_EAX;
  }
  else {
    sleep(3);
    kill(__pid,10);
    fVar3 = fdb_open(&dbfile,"./staleblktest1",&fconfig);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_kvs_open(dbfile,&db,"db",&kvs_config);
      pfVar2 = db;
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x63e);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x63e,"void superblock_recovery_test()");
      }
      builtin_strncpy(keybuf,"key0",5);
      sVar6 = strlen(keybuf);
      fVar3 = fdb_get_kv(pfVar2,keybuf,sVar6,&rvalue,&rvalue_len);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x643);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x643,"void superblock_recovery_test()");
      }
      fVar3 = fdb_free_block(rvalue);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x645);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x645,"void superblock_recovery_test()");
      }
      fVar3 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x649);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x649,"void superblock_recovery_test()");
      }
      if (num_markers != fconfig.num_keeping_headers) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x64a);
        superblock_recovery_test()::__test_pass = '\x01';
        if (num_markers != fconfig.num_keeping_headers) {
          __assert_fail("num_markers == fconfig.num_keeping_headers",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x64a,"void superblock_recovery_test()");
        }
      }
      fVar3 = fdb_compact_upto(dbfile,(char *)0x0,markers[4].marker);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x64c);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x64c,"void superblock_recovery_test()");
      }
      fVar3 = fdb_snapshot_open(db,&snap_db,(markers[4].kvs_markers)->seqnum);
      pFVar1 = _stderr;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x651);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x651,"void superblock_recovery_test()");
      }
      fVar3 = fdb_free_snap_markers(markers,num_markers);
      pfVar2 = snap_db;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        builtin_strncpy(keybuf,"key0",5);
        sVar6 = strlen(keybuf);
        fVar3 = fdb_get_kv(pfVar2,keybuf,sVar6,&rvalue,&rvalue_len);
        pFVar1 = _stderr;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pcVar7 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x659);
          superblock_recovery_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x659,"void superblock_recovery_test()");
        }
        iVar5 = bcmp(rvalue,"seqno0",rvalue_len);
        if (iVar5 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","seqno0",rvalue,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x65c);
          superblock_recovery_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x65c,"void superblock_recovery_test()");
        }
        fVar3 = fdb_free_block(rvalue);
        pFVar1 = _stderr;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pcVar7 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x65e);
          superblock_recovery_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x65e,"void superblock_recovery_test()");
        }
        fVar3 = fdb_kvs_close(snap_db);
        pFVar1 = _stderr;
        if (fVar3 == FDB_RESULT_SUCCESS) {
          fVar3 = fdb_kvs_close(db);
          pFVar1 = _stderr;
          if (fVar3 != FDB_RESULT_SUCCESS) {
            pcVar7 = fdb_error_msg(fVar3);
            fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,
                    pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x663);
            superblock_recovery_test()::__test_pass = 1;
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                          ,0x663,"void superblock_recovery_test()");
          }
          fVar3 = fdb_close(dbfile);
          pFVar1 = _stderr;
          if (fVar3 == FDB_RESULT_SUCCESS) {
            fdb_shutdown();
            memleak_end();
            pcVar7 = "%s PASSED\n";
            if (superblock_recovery_test()::__test_pass != '\0') {
              pcVar7 = "%s FAILED\n";
            }
            fprintf(_stderr,pcVar7,"superblock recovery test");
            return;
          }
          pcVar7 = fdb_error_msg(fVar3);
          fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x665);
          superblock_recovery_test()::__test_pass = 1;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x665,"void superblock_recovery_test()");
        }
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x661);
        superblock_recovery_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x661,"void superblock_recovery_test()");
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x654);
      superblock_recovery_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x654,"void superblock_recovery_test()");
    }
  }
  pFVar1 = _stderr;
  pcVar7 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x63c);
  superblock_recovery_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x63c,"void superblock_recovery_test()");
}

Assistant:

void superblock_recovery_test() {
    TEST_INIT();
    memleak_start();

    int r;
    uint64_t i, num_markers;
    void *rvalue;
    size_t rvalue_len;
    char keybuf[256];
    char bodybuf[256];
    pid_t child_id;

    fdb_seqnum_t seqno;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fdb_file_info file_info;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    for (i = 0; i < fconfig.num_keeping_headers + 1; i++) {
        sprintf(keybuf, "key");
        status = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_STATUS(status);

    while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE) {
        sprintf(keybuf, "key");
        sprintf(bodybuf, "body%d", static_cast<int>(i));
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    };

    TEST_CHK(sb_check_block_reusing(db) == SBD_RECLAIM);

    // close previous handle
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);

    // fork child
    child_id = fork();

    if (child_id == 0) {
        child_function();
    }

    // wait 3s
    sleep(3);

    // kill child
    kill(child_id, SIGUSR1);
    // reopen and recover

    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    TEST_STATUS(status);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    // compact upto marker
    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(num_markers == fconfig.num_keeping_headers);
    status = fdb_compact_upto(dbfile, NULL, markers[4].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open snapshot on marker
    seqno = markers[4].kvs_markers->seqnum;
    status = fdb_snapshot_open(db, &snap_db, seqno);
    TEST_STATUS(status);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // get known key
    sprintf(keybuf, "key0");
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf), &rvalue, &rvalue_len);
    TEST_STATUS(status);

    // check value
    TEST_CMP(rvalue, "seqno0", rvalue_len);
    status = fdb_free_block(rvalue);
    TEST_STATUS(status);

    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("superblock recovery test");
}